

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLEBABecLap.cpp
# Opt level: O2

void __thiscall
amrex::MLEBABecLap::MLEBABecLap
          (MLEBABecLap *this,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *a_geom,
          Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *a_grids,
          Vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_> *a_dmap,
          LPInfo *a_info,
          Vector<const_amrex::EBFArrayBoxFactory_*,_std::allocator<const_amrex::EBFArrayBoxFactory_*>_>
          *a_factory,int a_ncomp)

{
  MLCellABecLap::MLCellABecLap(&this->super_MLCellABecLap);
  (this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp =
       (_func_int **)&PTR__MLEBABecLap_007d5f00;
  this->m_ncomp = a_ncomp;
  this->m_needs_update = true;
  this->m_a_scalar = NAN;
  this->m_b_scalar = NAN;
  memset(&this->m_a_coeffs,0,0x90);
  define(this,a_geom,a_grids,a_dmap,a_info,a_factory);
  return;
}

Assistant:

MLEBABecLap::MLEBABecLap (const Vector<Geometry>& a_geom,
                          const Vector<BoxArray>& a_grids,
                          const Vector<DistributionMapping>& a_dmap,
                          const LPInfo& a_info,
                          const Vector<EBFArrayBoxFactory const*>& a_factory,
                          const int a_ncomp)
    : m_ncomp(a_ncomp)
{
    define(a_geom, a_grids, a_dmap, a_info, a_factory);
}